

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O0

void ShowDockingDisabledMessage(void)

{
  bool bVar1;
  ImGuiIO_conflict *pIVar2;
  ImGuiIO_conflict *io;
  
  pIVar2 = ImGui::GetIO();
  ImGui::Text("ERROR: Docking is not enabled! See Demo > Configuration.");
  ImGui::Text("Set io.ConfigFlags |= ImGuiConfigFlags_DockingEnable in your code, or ");
  ImGui::SameLine(0.0,0.0);
  bVar1 = ImGui::SmallButton("click here");
  if (bVar1) {
    pIVar2->ConfigFlags = pIVar2->ConfigFlags | 0x40;
  }
  return;
}

Assistant:

static void ShowDockingDisabledMessage()
{
    ImGuiIO& io = ImGui::GetIO();
    ImGui::Text("ERROR: Docking is not enabled! See Demo > Configuration.");
    ImGui::Text("Set io.ConfigFlags |= ImGuiConfigFlags_DockingEnable in your code, or ");
    ImGui::SameLine(0.0f, 0.0f);
    if (ImGui::SmallButton("click here"))
        io.ConfigFlags |= ImGuiConfigFlags_DockingEnable;
}